

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string_t * __thiscall
el::base::utils::DateTime::formatTime_abi_cxx11_
          (string_t *__return_storage_ptr__,DateTime *this,unsigned_long_long time,
          TimestampUnit timestampUnit)

{
  double dVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  stringstream_t ss;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  uVar4 = time & 0xffffffff;
  puVar5 = (undefined8 *)(consts::kTimeFormats + uVar4 * 0x10 + 8);
  for (; ((uVar4 < 5 &&
          (auVar6._8_4_ = (int)((ulong)this >> 0x20), auVar6._0_8_ = this,
          auVar6._12_4_ = 0x45300000, dVar1 = (double)puVar5[-1],
          dVar1 < (auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0))) &&
         ((dVar1 != 1000.0 || ((NAN(dVar1) || (1.9 <= (float)this / 1000.0))))));
      this = (DateTime *)
             ((ulong)this /
             (ulong)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1))) {
    uVar4 = uVar4 + 1;
    puVar5 = puVar5 + 2;
  }
  pcVar2 = (char *)*puVar5;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = ::std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_190);
  poVar3 = ::std::operator<<(poVar3," ");
  ::std::operator<<(poVar3,pcVar2);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

base::type::string_t DateTime::formatTime(unsigned long long time, base::TimestampUnit timestampUnit) {
  base::type::EnumType start = static_cast<base::type::EnumType>(timestampUnit);
  const base::type::char_t* unit = base::consts::kTimeFormats[start].unit;
  for (base::type::EnumType i = start; i < base::consts::kTimeFormatsCount - 1; ++i) {
    if (time <= base::consts::kTimeFormats[i].value) {
      break;
    }
    if (base::consts::kTimeFormats[i].value == 1000.0f && time / 1000.0f < 1.9f) {
      break;
    }
    time /= static_cast<decltype(time)>(base::consts::kTimeFormats[i].value);
    unit = base::consts::kTimeFormats[i + 1].unit;
  }
  base::type::stringstream_t ss;
  ss << time << " " << unit;
  return ss.str();
}